

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
::decrement_slow(btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
                 *this)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  byte bVar4;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar5;
  template_ElementType<3UL> *ppbVar6;
  btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
  *pbVar7;
  ulong uVar8;
  btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>,_std::pair<const_int,_int>_&,_std::pair<const_int,_int>_*>
  save;
  int iStack_30;
  
  bVar3 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
          ::leaf(this->node);
  uVar1 = this->position;
  uVar8 = (ulong)uVar1;
  if (bVar3) {
    if (-1 < (int)uVar1) {
      __assert_fail("position <= -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x989,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                   );
    }
    pbVar7 = this->node;
    uVar2 = *(undefined8 *)&this->position;
    while ((int)uVar8 < 0) {
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              ::is_root(this->node);
      if (bVar3) {
        if (-1 < this->position) {
          return;
        }
        iStack_30 = (int)uVar2;
        this->position = iStack_30;
        this->node = pbVar7;
        return;
      }
      pbVar5 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               ::parent(this->node);
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              ::position(this->node);
      ppbVar6 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                 *)pbVar5);
      if (ppbVar6[bVar4] != this->node) {
        __assert_fail("node->parent()->child(node->position()) == node",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x98c,
                      "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                     );
      }
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              ::position(this->node);
      this->position = bVar4 - 1;
      pbVar5 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
               ::parent(this->node);
      this->node = pbVar5;
      uVar8 = (ulong)(uint)this->position;
    }
  }
  else {
    if ((int)uVar1 < 0) {
      __assert_fail("position >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x994,
                    "void phmap::priv::btree_iterator<phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, std::pair<const int, int> &, std::pair<const int, int> *>::decrement_slow() [Node = phmap::priv::btree_node<phmap::priv::map_params<int, int, std::greater<int>, std::allocator<std::pair<const int, int>>, 256, true>>, Reference = std::pair<const int, int> &, Pointer = std::pair<const int, int> *]"
                   );
    }
    pbVar7 = this->node;
    do {
      ppbVar6 = btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                ::GetField<3ul>((btree_node<phmap::priv::map_params<int,int,std::greater<int>,std::allocator<std::pair<int_const,int>>,256,true>>
                                 *)pbVar7);
      pbVar7 = ppbVar6[uVar8];
      this->node = pbVar7;
      bVar3 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              ::leaf(pbVar7);
      pbVar7 = this->node;
      bVar4 = btree_node<phmap::priv::map_params<int,_int,_std::greater<int>,_std::allocator<std::pair<const_int,_int>_>,_256,_true>_>
              ::count(pbVar7);
      uVar8 = (ulong)bVar4;
    } while (!bVar3);
    this->position = bVar4 - 1;
  }
  return;
}

Assistant:

void btree_iterator<N, R, P>::decrement_slow() {
        if (node->leaf()) {
            assert(position <= -1);
            btree_iterator save(*this);
            while (position < 0 && !node->is_root()) {
                assert(node->parent()->child(node->position()) == node);
                position = node->position() - 1;
                node = node->parent();
            }
            if (position < 0) {
                *this = save;
            }
        } else {
            assert(position >= 0);
            node = node->child(position);
            while (!node->leaf()) {
                node = node->child(node->count());
            }
            position = node->count() - 1;
        }
    }